

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O3

bool __thiscall
duckdb::SortedAggregateBindData::Equals(SortedAggregateBindData *this,FunctionData *other_p)

{
  pointer pBVar1;
  pointer pBVar2;
  bool bVar3;
  int iVar4;
  pointer pFVar5;
  type pFVar6;
  const_reference this_00;
  const_reference other;
  size_type __n;
  
  if ((this->bind_info).
      super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
      super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
      super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl == (FunctionData *)0x0) {
    if (other_p[0x2b]._vptr_FunctionData != (_func_int **)0x0) {
      return false;
    }
  }
  else {
    if (other_p[0x2b]._vptr_FunctionData == (_func_int **)0x0) {
      return false;
    }
    pFVar5 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
             operator->(&this->bind_info);
    pFVar6 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
             operator*((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                        *)(other_p + 0x2b));
    iVar4 = (*pFVar5->_vptr_FunctionData[3])(pFVar5,pFVar6);
    if ((char)iVar4 == '\0') {
      return false;
    }
  }
  bVar3 = AggregateFunction::operator==(&this->function,(AggregateFunction *)(other_p + 2));
  if (bVar3) {
    pBVar1 = (this->orders).
             super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
             super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar2 = (this->orders).
             super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
             super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((long)pBVar2 - (long)pBVar1 ==
        (long)other_p[0x30]._vptr_FunctionData - (long)other_p[0x2f]._vptr_FunctionData) {
      if (pBVar2 == pBVar1) {
        return true;
      }
      __n = 0;
      do {
        this_00 = vector<duckdb::BoundOrderByNode,_true>::operator[](&this->orders,__n);
        other = vector<duckdb::BoundOrderByNode,_true>::operator[]
                          ((vector<duckdb::BoundOrderByNode,_true> *)(other_p + 0x2f),__n);
        bVar3 = BoundOrderByNode::Equals(this_00,other);
        if (!bVar3) {
          return bVar3;
        }
        __n = __n + 1;
      } while (__n < (ulong)(((long)(this->orders).
                                    super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                                    .
                                    super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->orders).
                                    super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                                    .
                                    super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool Equals(const FunctionData &other_p) const override {
		auto &other = other_p.Cast<SortedAggregateBindData>();
		if (bind_info && other.bind_info) {
			if (!bind_info->Equals(*other.bind_info)) {
				return false;
			}
		} else if (bind_info || other.bind_info) {
			return false;
		}
		if (function != other.function) {
			return false;
		}
		if (orders.size() != other.orders.size()) {
			return false;
		}
		for (size_t i = 0; i < orders.size(); ++i) {
			if (!orders[i].Equals(other.orders[i])) {
				return false;
			}
		}
		return true;
	}